

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

bool search::isRepetition(Board *pos)

{
  vector<board::Undo,_std::allocator<board::Undo>_> *__x;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  pointer pUVar4;
  pointer pUVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  vector<board::Undo,_std::allocator<board::Undo>_> local_50;
  Board *local_38;
  
  __x = &pos->history;
  std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&local_50,__x);
  lVar8 = (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  iVar1 = pos->fiftyMove;
  local_38 = pos;
  if (local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar10 = lVar8 * 8 + (long)iVar1 * -0x18 + 0x10;
  uVar6 = lVar8 * -0x5555555555555555 - (long)iVar1;
  do {
    uVar7 = uVar6;
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&local_50,__x);
    pUVar5 = local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pUVar4 = local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar9 = ((long)pUVar5 - (long)pUVar4 >> 3) * -0x5555555555555555;
    if (uVar9 <= uVar7) break;
    uVar2 = local_38->hashKey;
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector(&local_50,__x);
    uVar3 = *(uint64_t *)
             ((long)&(local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl
                      .super__Vector_impl_data._M_start)->castlePerm + lVar10);
    if (local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<board::Undo,_std::allocator<board::Undo>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    lVar10 = lVar10 + 0x18;
    uVar6 = uVar7 + 1;
  } while (uVar2 != uVar3);
  return uVar7 < uVar9;
}

Assistant:

bool search::isRepetition(board::Board& pos)
{
    for (size_t i = pos.getHistory().size() - pos.getFiftyMove(); i < pos.getHistory().size(); i++) {
        if (pos.getHashKey() == pos.getHistory()[i].getHashKey()) {
            return true;
        }
    }
    return false;
}